

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdate(void)

{
  float *pfVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImVec2 *pIVar6;
  value_type *pvVar7;
  ImRect *this;
  float fVar8;
  float fVar9;
  float lhs;
  ImVec2 IVar10;
  float local_164;
  float local_14c;
  uint local_144;
  bool local_13e;
  byte local_13d;
  byte local_13c;
  byte local_139;
  ImVec2 local_128;
  float local_11c;
  float local_118;
  ImVec2 local_114;
  ImVec2 local_10c;
  ImRect local_104;
  undefined1 local_f4 [8];
  ImRect nav_rect_rel;
  float pad;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [8];
  ImRect window_rect_rel;
  ImGuiWindow *window_1;
  float fStack_88;
  ImVec2 scroll_dir;
  float scroll_speed;
  ImGuiWindow *window;
  int allowed_dir_flags;
  bool activate_pressed;
  bool activate_down;
  ImGuiWindow *parent_window;
  ImGuiWindow *child_window;
  bool nav_gamepad_active;
  bool nav_keyboard_active;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 next_scroll;
  ImVec2 local_38;
  undefined1 local_30 [8];
  ImRect rect_abs;
  ImGuiNavMoveResult *result;
  int i;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  (GImGui->IO).WantSetMousePos = false;
  if (((((pIVar4->IO).ConfigFlags & 2U) != 0) && (((pIVar4->IO).BackendFlags & 1U) != 0)) &&
     ((0.0 < (pIVar4->IO).NavInputs[0] ||
      (((0.0 < (pIVar4->IO).NavInputs[2] || (0.0 < (pIVar4->IO).NavInputs[1])) ||
       (0.0 < (pIVar4->IO).NavInputs[3])))))) {
    pIVar4->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if (((pIVar4->IO).ConfigFlags & 1U) != 0) {
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xc]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xd]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[2] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xe]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[1] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[1]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x11] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[2]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x12] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[3]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x13] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[4]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x14] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    if (((pIVar4->IO).KeyCtrl & 1U) != 0) {
      (pIVar4->IO).NavInputs[0xe] = 1.0;
    }
    if (((pIVar4->IO).KeyShift & 1U) != 0) {
      (pIVar4->IO).NavInputs[0xf] = 1.0;
    }
    if (((pIVar4->IO).KeyAlt & 1U) != 0) {
      (pIVar4->IO).NavInputs[0x10] = 1.0;
    }
  }
  memcpy((pIVar4->IO).NavInputsDownDurationPrev,(pIVar4->IO).NavInputsDownDuration,0x54);
  for (result._4_4_ = 0; result._4_4_ < 0x15; result._4_4_ = result._4_4_ + 1) {
    if ((pIVar4->IO).NavInputs[result._4_4_] <= 0.0) {
      local_11c = -1.0;
    }
    else {
      pfVar1 = (pIVar4->IO).NavInputsDownDuration + result._4_4_;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_118 = (pIVar4->IO).NavInputsDownDuration[result._4_4_] + (pIVar4->IO).DeltaTime;
      }
      else {
        local_118 = 0.0;
      }
      local_11c = local_118;
    }
    (pIVar4->IO).NavInputsDownDuration[result._4_4_] = local_11c;
  }
  if ((pIVar4->NavInitResultId != 0) &&
     (((pIVar4->NavDisableHighlight & 1U) == 0 || ((pIVar4->NavInitRequestFromMove & 1U) != 0)))) {
    if (pIVar4->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc08,"void ImGui::NavUpdate()");
    }
    if ((pIVar4->NavInitRequestFromMove & 1U) == 0) {
      SetNavID(pIVar4->NavInitResultId,pIVar4->NavLayer);
    }
    else {
      SetNavIDWithRectRel(pIVar4->NavInitResultId,pIVar4->NavLayer,&pIVar4->NavInitResultRectRel);
    }
    pIVar6 = &pIVar4->NavWindow->NavRectRel[pIVar4->NavLayer].Min;
    *pIVar6 = (pIVar4->NavInitResultRectRel).Min;
    pIVar6[1] = (pIVar4->NavInitResultRectRel).Max;
  }
  pIVar4->NavInitRequest = false;
  pIVar4->NavInitRequestFromMove = false;
  pIVar4->NavInitResultId = 0;
  pIVar4->NavJustMovedToId = 0;
  if (((pIVar4->NavMoveRequest & 1U) == 0) ||
     (((pIVar4->NavMoveResultLocal).ID == 0 && ((pIVar4->NavMoveResultOther).ID == 0))))
  goto LAB_001b8a77;
  if ((pIVar4->NavMoveResultLocal).ID == 0) {
    local_128 = (ImVec2)&pIVar4->NavMoveResultOther;
  }
  else {
    local_128 = (ImVec2)&pIVar4->NavMoveResultLocal;
  }
  rect_abs.Max = local_128;
  if (((pIVar4->NavMoveResultOther).ID != 0) &&
     (((pIVar4->NavMoveResultOther).Window)->ParentWindow == pIVar4->NavWindow)) {
    if ((pIVar4->NavMoveResultLocal).DistBox <= (pIVar4->NavMoveResultOther).DistBox) {
      fVar8 = (pIVar4->NavMoveResultOther).DistBox;
      pfVar1 = &(pIVar4->NavMoveResultLocal).DistBox;
      if (((fVar8 != *pfVar1) || (NAN(fVar8) || NAN(*pfVar1))) ||
         ((pIVar4->NavMoveResultLocal).DistCenter <= (pIVar4->NavMoveResultOther).DistCenter))
      goto LAB_001b88ec;
    }
    rect_abs.Max = (ImVec2)&pIVar4->NavMoveResultOther;
  }
LAB_001b88ec:
  bVar5 = false;
  if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
    bVar5 = *(long *)((long)rect_abs.Max + 8) != 0;
  }
  if (!bVar5) {
    __assert_fail("g.NavWindow && result->Window",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc1d,"void ImGui::NavUpdate()");
  }
  if (pIVar4->NavLayer == 0) {
    local_38 = ::operator+((ImVec2 *)((long)rect_abs.Max + 0x1c),
                           (ImVec2 *)(*(long *)((long)rect_abs.Max + 8) + 0x10));
    next_scroll = ::operator+((ImVec2 *)((long)rect_abs.Max + 0x24),
                              (ImVec2 *)(*(long *)((long)rect_abs.Max + 8) + 0x10));
    ImRect::ImRect((ImRect *)local_30,&local_38,&next_scroll);
    NavScrollToBringItemIntoView(*(ImGuiWindow **)((long)rect_abs.Max + 8),(ImRect *)local_30);
    if ((*(uint *)(*(long *)((long)rect_abs.Max + 8) + 0xc) & 0x1000000) != 0) {
      NavScrollToBringItemIntoView
                (*(ImGuiWindow **)(*(long *)((long)rect_abs.Max + 8) + 0x360),(ImRect *)local_30);
    }
    local_48 = CalcNextScrollFromScrollTargetAndClamp
                         (*(ImGuiWindow **)((long)rect_abs.Max + 8),false);
    this = (ImRect *)((long)rect_abs.Max + 0x1c);
    local_50 = ::operator-((ImVec2 *)(*(long *)((long)rect_abs.Max + 8) + 0x58),&local_48);
    ImRect::Translate(this,&local_50);
  }
  ClearActiveID();
  pIVar4->NavWindow = *(ImGuiWindow **)((long)rect_abs.Max + 8);
  SetNavIDWithRectRel(*(ImGuiID *)rect_abs.Max,pIVar4->NavLayer,
                      (ImRect *)((long)rect_abs.Max + 0x1c));
  pIVar4->NavJustMovedToId = *(ImGuiID *)rect_abs.Max;
  pIVar4->NavMoveFromClampedRefRect = false;
LAB_001b8a77:
  if (pIVar4->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if ((pIVar4->NavMoveRequest & 1U) == 0) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc37,"void ImGui::NavUpdate()");
    }
    if (((pIVar4->NavMoveResultLocal).ID == 0) && ((pIVar4->NavMoveResultOther).ID == 0)) {
      pIVar4->NavDisableHighlight = false;
    }
    pIVar4->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if (((pIVar4->NavMousePosDirty & 1U) != 0) && ((pIVar4->NavIdIsAlive & 1U) != 0)) {
    if ((((pIVar4->IO).ConfigFlags & 4U) != 0) && (((pIVar4->IO).BackendFlags & 4U) != 0)) {
      local_139 = 0;
      if ((pIVar4->NavDisableHighlight & 1U) == 0) {
        local_139 = pIVar4->NavDisableMouseHover;
      }
      if ((local_139 & 1) == 0) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc43,"void ImGui::NavUpdate()");
      }
      IVar10 = NavCalcPreferredRefPos();
      (pIVar4->IO).MousePosPrev = IVar10;
      (pIVar4->IO).MousePos = (pIVar4->IO).MousePosPrev;
      (pIVar4->IO).WantSetMousePos = true;
    }
    pIVar4->NavMousePosDirty = false;
  }
  pIVar4->NavIdIsAlive = false;
  pIVar4->NavJustTabbedId = 0;
  bVar5 = true;
  if (pIVar4->NavLayer != 0) {
    bVar5 = pIVar4->NavLayer == 1;
  }
  if (!bVar5) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc4b,"void ImGui::NavUpdate()");
  }
  if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
    NavSaveLastChildNavWindow(pIVar4->NavWindow);
  }
  if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
      (pIVar4->NavWindow->NavLastChildNavWindow != (ImGuiWindow *)0x0)) && (pIVar4->NavLayer == 0))
  {
    pIVar4->NavWindow->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  }
  NavUpdateWindowing();
  bVar5 = false;
  if (((pIVar4->IO).ConfigFlags & 2U) != 0) {
    bVar5 = ((pIVar4->IO).BackendFlags & 1U) != 0;
  }
  if (((((pIVar4->IO).ConfigFlags & 1U) != 0) || (local_13c = 0, bVar5)) &&
     (local_13c = 0, pIVar4->NavWindow != (ImGuiWindow *)0x0)) {
    local_13c = (pIVar4->NavWindow->Flags & 0x40000U) != 0 ^ 0xff;
  }
  (pIVar4->IO).NavActive = (bool)(local_13c & 1);
  if ((((((pIVar4->IO).NavActive & 1U) == 0) || (pIVar4->NavId == 0)) ||
      (local_13d = 1, (pIVar4->NavDisableHighlight & 1U) != 0)) &&
     (local_13d = 1, pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    local_13d = pIVar4->NavInitRequest;
  }
  (pIVar4->IO).NavVisible = (bool)(local_13d & 1);
  bVar5 = IsNavInputPressed(1,ImGuiInputReadMode_Pressed);
  if (bVar5) {
    if (pIVar4->ActiveId == 0) {
      if ((((pIVar4->NavWindow == (ImGuiWindow *)0x0) ||
           ((pIVar4->NavWindow->Flags & 0x1000000U) == 0)) ||
          ((pIVar4->NavWindow->Flags & 0x4000000U) != 0)) ||
         (pIVar4->NavWindow->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar4->OpenPopupStack).Size < 1) {
          if (pIVar4->NavLayer == 0) {
            if ((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
               (((pIVar4->NavWindow->Flags & 0x4000000U) != 0 ||
                ((pIVar4->NavWindow->Flags & 0x1000000U) == 0)))) {
              pIVar4->NavWindow->NavLastIds[0] = 0;
            }
            pIVar4->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else {
          pvVar7 = ImVector<ImGuiPopupRef>::back(&pIVar4->OpenPopupStack);
          if ((pvVar7->Window->Flags & 0x8000000U) == 0) {
            ClosePopupToLevel((pIVar4->OpenPopupStack).Size + -1);
          }
        }
      }
      else {
        pIVar3 = pIVar4->NavWindow;
        if (pIVar3->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0xc67,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar4->NavWindow->ParentWindow);
        SetNavID(pIVar3->ChildId,0);
        pIVar4->NavIdIsAlive = false;
        if ((pIVar4->NavDisableMouseHover & 1U) != 0) {
          pIVar4->NavMousePosDirty = true;
        }
      }
    }
    else {
      ClearActiveID();
    }
  }
  pIVar4->NavInputId = 0;
  pIVar4->NavActivatePressedId = 0;
  pIVar4->NavActivateDownId = 0;
  pIVar4->NavActivateId = 0;
  if (((pIVar4->NavId != 0) && ((pIVar4->NavDisableHighlight & 1U) == 0)) &&
     ((pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0 &&
      ((pIVar4->NavWindow != (ImGuiWindow *)0x0 && ((pIVar4->NavWindow->Flags & 0x40000U) == 0))))))
  {
    bVar5 = IsNavInputDown(0);
    local_13e = false;
    if (bVar5) {
      local_13e = IsNavInputPressed(0,ImGuiInputReadMode_Pressed);
    }
    if ((pIVar4->ActiveId == 0) && (local_13e != false)) {
      pIVar4->NavActivateId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) && (bVar5)) {
      pIVar4->NavActivateDownId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) && (local_13e != false)) {
      pIVar4->NavActivatePressedId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) &&
       (bVar5 = IsNavInputPressed(2,ImGuiInputReadMode_Pressed), bVar5)) {
      pIVar4->NavInputId = pIVar4->NavId;
    }
  }
  if ((pIVar4->NavWindow != (ImGuiWindow *)0x0) && ((pIVar4->NavWindow->Flags & 0x40000U) != 0)) {
    pIVar4->NavDisableHighlight = true;
  }
  if ((pIVar4->NavActivateId != 0) && (pIVar4->NavActivateDownId != pIVar4->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc94,"void ImGui::NavUpdate()");
  }
  pIVar4->NavMoveRequest = false;
  if (pIVar4->NavNextActivateId != 0) {
    IVar2 = pIVar4->NavNextActivateId;
    pIVar4->NavInputId = IVar2;
    pIVar4->NavActivatePressedId = IVar2;
    pIVar4->NavActivateDownId = IVar2;
    pIVar4->NavActivateId = IVar2;
  }
  pIVar4->NavNextActivateId = 0;
  if (pIVar4->ActiveId == 0) {
    local_144 = 0xffffffff;
  }
  else {
    local_144 = pIVar4->ActiveIdAllowNavDirFlags;
  }
  if (pIVar4->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar4->NavMoveDir = -1;
    pIVar4->NavMoveRequestFlags = 0;
    if ((((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) && (local_144 != 0)) &&
       ((pIVar4->NavWindow->Flags & 0x40000U) == 0)) {
      if (((local_144 & 1) != 0) &&
         (bVar5 = IsNavInputPressedAnyOfTwo(4,0x11,ImGuiInputReadMode_Repeat), bVar5)) {
        pIVar4->NavMoveDir = 0;
      }
      if (((local_144 & 2) != 0) &&
         (bVar5 = IsNavInputPressedAnyOfTwo(5,0x12,ImGuiInputReadMode_Repeat), bVar5)) {
        pIVar4->NavMoveDir = 1;
      }
      if (((local_144 & 4) != 0) &&
         (bVar5 = IsNavInputPressedAnyOfTwo(6,0x13,ImGuiInputReadMode_Repeat), bVar5)) {
        pIVar4->NavMoveDir = 2;
      }
      if (((local_144 & 8) != 0) &&
         (bVar5 = IsNavInputPressedAnyOfTwo(7,0x14,ImGuiInputReadMode_Repeat), bVar5)) {
        pIVar4->NavMoveDir = 3;
      }
    }
    pIVar4->NavMoveClipDir = pIVar4->NavMoveDir;
  }
  else {
    bVar5 = false;
    if (pIVar4->NavMoveDir != -1) {
      bVar5 = pIVar4->NavMoveClipDir != -1;
    }
    if (!bVar5) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcaf,"void ImGui::NavUpdate()");
    }
    if (pIVar4->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcb0,"void ImGui::NavUpdate()");
    }
    pIVar4->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  if (pIVar4->NavMoveDir != -1) {
    pIVar4->NavMoveRequest = true;
    pIVar4->NavMoveDirLast = pIVar4->NavMoveDir;
  }
  if (((pIVar4->NavMoveRequest & 1U) != 0) && (pIVar4->NavId == 0)) {
    pIVar4->NavInitRequestFromMove = true;
    pIVar4->NavInitRequest = true;
    pIVar4->NavInitResultId = 0;
    pIVar4->NavDisableHighlight = false;
  }
  NavUpdateAnyRequestFlag();
  if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) && ((pIVar4->NavWindow->Flags & 0x40000U) == 0)) &&
     (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    pIVar3 = pIVar4->NavWindow;
    fVar8 = ImGuiWindow::CalcFontSize(pIVar3);
    fVar8 = ImFloor(fVar8 * 100.0 * (pIVar4->IO).DeltaTime + 0.5);
    if ((((pIVar3->DC).NavLayerActiveMask == 0) && (((pIVar3->DC).NavHasScroll & 1U) != 0)) &&
       ((pIVar4->NavMoveRequest & 1U) != 0)) {
      if ((pIVar4->NavMoveDir == 0) || (pIVar4->NavMoveDir == 1)) {
        local_14c = -1.0;
        if (pIVar4->NavMoveDir != 0) {
          local_14c = 1.0;
        }
        fVar9 = ImFloor(local_14c * fVar8 + (pIVar3->Scroll).x);
        SetWindowScrollX(pIVar3,fVar9);
      }
      if ((pIVar4->NavMoveDir == 2) || (pIVar4->NavMoveDir == 3)) {
        local_164 = -1.0;
        if (pIVar4->NavMoveDir != 2) {
          local_164 = 1.0;
        }
        fVar9 = ImFloor(local_164 * fVar8 + (pIVar3->Scroll).y);
        SetWindowScrollY(pIVar3,fVar9);
      }
    }
    IVar10 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    window_1._4_4_ = IVar10.x;
    if (((window_1._4_4_ != 0.0) || (NAN(window_1._4_4_))) && ((pIVar3->ScrollbarX & 1U) != 0)) {
      fVar9 = ImFloor(window_1._4_4_ * fVar8 + (pIVar3->Scroll).x);
      SetWindowScrollX(pIVar3,fVar9);
      pIVar4->NavMoveFromClampedRefRect = true;
    }
    fStack_88 = IVar10.y;
    if ((fStack_88 != 0.0) || (NAN(fStack_88))) {
      fVar8 = ImFloor(fStack_88 * fVar8 + (pIVar3->Scroll).y);
      SetWindowScrollY(pIVar3,fVar8);
      pIVar4->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar4->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar4->NavMoveResultOther);
  if ((((pIVar4->NavMoveRequest & 1U) != 0) && ((pIVar4->NavMoveFromClampedRefRect & 1U) != 0)) &&
     (pIVar4->NavLayer == 0)) {
    window_rect_rel.Max = (ImVec2)pIVar4->NavWindow;
    local_b8 = ::operator-((ImVec2 *)((long)window_rect_rel.Max + 0x220),
                           (ImVec2 *)((long)window_rect_rel.Max + 0x10));
    ImVec2::ImVec2(&local_c0,1.0,1.0);
    local_b0 = ::operator-(&local_b8,&local_c0);
    local_d0 = ::operator-((ImVec2 *)((long)window_rect_rel.Max + 0x228),
                           (ImVec2 *)((long)window_rect_rel.Max + 0x10));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,1.0,1.0);
    local_c8 = ::operator+(&local_d0,(ImVec2 *)&stack0xffffffffffffff28);
    ImRect::ImRect((ImRect *)local_a8,&local_b0,&local_c8);
    bVar5 = ImRect::Contains((ImRect *)local_a8,
                             (ImRect *)
                             ((long)window_rect_rel.Max + 0x398 + (long)pIVar4->NavLayer * 0x10));
    if (!bVar5) {
      fVar8 = ImGuiWindow::CalcFontSize((ImGuiWindow *)window_rect_rel.Max);
      fVar9 = ImRect::GetWidth((ImRect *)local_a8);
      fVar9 = ImMin<float>(fVar9,fVar8 * 0.5);
      lhs = ImRect::GetHeight((ImRect *)local_a8);
      fVar8 = ImMin<float>(lhs,fVar8 * 0.5);
      ImVec2::ImVec2(&nav_rect_rel.Max,-fVar9,-fVar8);
      ImRect::Expand((ImRect *)local_a8,&nav_rect_rel.Max);
      ImRect::ClipWith((ImRect *)((long)window_rect_rel.Max + 0x398 + (long)pIVar4->NavLayer * 0x10)
                       ,(ImRect *)local_a8);
      pIVar4->NavId = 0;
    }
    pIVar4->NavMoveFromClampedRefRect = false;
  }
  if ((pIVar4->NavWindow == (ImGuiWindow *)0x0) ||
     (bVar5 = ImRect::IsInverted(pIVar4->NavWindow->NavRectRel + pIVar4->NavLayer), bVar5)) {
    ImRect::ImRect((ImRect *)local_f4,0.0,0.0,0.0,0.0);
  }
  else {
    pIVar6 = &pIVar4->NavWindow->NavRectRel[pIVar4->NavLayer].Min;
    local_f4 = *(undefined1 (*) [8])pIVar6;
    nav_rect_rel.Min = pIVar6[1];
  }
  if (pIVar4->NavWindow == (ImGuiWindow *)0x0) {
    local_104 = GetViewportRect();
  }
  else {
    local_10c = ::operator+(&pIVar4->NavWindow->Pos,(ImVec2 *)local_f4);
    local_114 = ::operator+(&pIVar4->NavWindow->Pos,&nav_rect_rel.Min);
    ImRect::ImRect(&local_104,&local_10c,&local_114);
  }
  (pIVar4->NavScoringRectScreen).Min = local_104.Min;
  (pIVar4->NavScoringRectScreen).Max = local_104.Max;
  fVar8 = ImMin<float>((pIVar4->NavScoringRectScreen).Min.x + 1.0,
                       (pIVar4->NavScoringRectScreen).Max.x);
  (pIVar4->NavScoringRectScreen).Min.x = fVar8;
  (pIVar4->NavScoringRectScreen).Max.x = (pIVar4->NavScoringRectScreen).Min.x;
  bVar5 = ImRect::IsInverted(&pIVar4->NavScoringRectScreen);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    pIVar4->NavScoringCount = 0;
    return;
  }
  __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0xcf9,"void ImGui::NavUpdate()");
}

Assistant:

static void ImGui::NavUpdate()
{
    ImGuiContext& g = *GImGui;
    g.IO.WantSetMousePos = false;

#if 0
    if (g.NavScoringCount > 0) printf("[%05d] NavScoringCount %d for '%s' layer %d (Init:%d, Move:%d)\n", g.FrameCount, g.NavScoringCount, g.NavWindow ? g.NavWindow->Name : "NULL", g.NavLayer, g.NavInitRequest || g.NavInitResultId != 0, g.NavMoveRequest);
#endif

    if ((g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) && (g.IO.BackendFlags & ImGuiBackendFlags_HasGamepad))
        if (g.IO.NavInputs[ImGuiNavInput_Activate] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Input] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Cancel] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Menu] > 0.0f)
            g.NavInputSource = ImGuiInputSource_NavGamepad;

    // Update Keyboard->Nav inputs mapping
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
    {
        #define NAV_MAP_KEY(_KEY, _NAV_INPUT) if (IsKeyDown(g.IO.KeyMap[_KEY])) { g.IO.NavInputs[_NAV_INPUT] = 1.0f; g.NavInputSource = ImGuiInputSource_NavKeyboard; }
        NAV_MAP_KEY(ImGuiKey_Space,     ImGuiNavInput_Activate );
        NAV_MAP_KEY(ImGuiKey_Enter,     ImGuiNavInput_Input    );
        NAV_MAP_KEY(ImGuiKey_Escape,    ImGuiNavInput_Cancel   );
        NAV_MAP_KEY(ImGuiKey_LeftArrow, ImGuiNavInput_KeyLeft_ );
        NAV_MAP_KEY(ImGuiKey_RightArrow,ImGuiNavInput_KeyRight_);
        NAV_MAP_KEY(ImGuiKey_UpArrow,   ImGuiNavInput_KeyUp_   );
        NAV_MAP_KEY(ImGuiKey_DownArrow, ImGuiNavInput_KeyDown_ );
        if (g.IO.KeyCtrl)   g.IO.NavInputs[ImGuiNavInput_TweakSlow] = 1.0f;
        if (g.IO.KeyShift)  g.IO.NavInputs[ImGuiNavInput_TweakFast] = 1.0f;
        if (g.IO.KeyAlt)    g.IO.NavInputs[ImGuiNavInput_KeyMenu_]  = 1.0f;
        #undef NAV_MAP_KEY
    }

    memcpy(g.IO.NavInputsDownDurationPrev, g.IO.NavInputsDownDuration, sizeof(g.IO.NavInputsDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.NavInputs); i++)
        g.IO.NavInputsDownDuration[i] = (g.IO.NavInputs[i] > 0.0f) ? (g.IO.NavInputsDownDuration[i] < 0.0f ? 0.0f : g.IO.NavInputsDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Process navigation init request (select first/default focus)
    if (g.NavInitResultId != 0 && (!g.NavDisableHighlight || g.NavInitRequestFromMove))
    {
        // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
        IM_ASSERT(g.NavWindow);
        if (g.NavInitRequestFromMove)
            SetNavIDWithRectRel(g.NavInitResultId, g.NavLayer, g.NavInitResultRectRel);
        else
            SetNavID(g.NavInitResultId, g.NavLayer);
        g.NavWindow->NavRectRel[g.NavLayer] = g.NavInitResultRectRel;
    }
    g.NavInitRequest = false;
    g.NavInitRequestFromMove = false;
    g.NavInitResultId = 0;
    g.NavJustMovedToId = 0;

    // Process navigation move request
    if (g.NavMoveRequest && (g.NavMoveResultLocal.ID != 0 || g.NavMoveResultOther.ID != 0))
    {
        // Select which result to use
        ImGuiNavMoveResult* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
        if (g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow) // Maybe entering a flattened child? In this case solve the tie using the regular scoring rules
            if ((g.NavMoveResultOther.DistBox < g.NavMoveResultLocal.DistBox) || (g.NavMoveResultOther.DistBox == g.NavMoveResultLocal.DistBox && g.NavMoveResultOther.DistCenter < g.NavMoveResultLocal.DistCenter))
                result = &g.NavMoveResultOther;

        IM_ASSERT(g.NavWindow && result->Window);

        // Scroll to keep newly navigated item fully into view. Also scroll parent window if necessary.
        if (g.NavLayer == 0)
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            NavScrollToBringItemIntoView(result->Window, rect_abs);
            if (result->Window->Flags & ImGuiWindowFlags_ChildWindow)
                NavScrollToBringItemIntoView(result->Window->ParentWindow, rect_abs);

            // Estimate upcoming scroll so we can offset our result position so mouse position can be applied immediately after in NavUpdate()
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(result->Window, false);
            result->RectRel.Translate(result->Window->Scroll - next_scroll);
        }

        // Apply result from previous frame navigation directional move request
        ClearActiveID();
        g.NavWindow = result->Window;
        SetNavIDWithRectRel(result->ID, g.NavLayer, result->RectRel);
        g.NavJustMovedToId = result->ID;
        g.NavMoveFromClampedRefRect = false;
    }

    // When a forwarded move request failed, we restore the highlight that we disabled during the forward frame
    if (g.NavMoveRequestForward == ImGuiNavForward_ForwardActive)
    {
        IM_ASSERT(g.NavMoveRequest);
        if (g.NavMoveResultLocal.ID == 0 && g.NavMoveResultOther.ID == 0)
            g.NavDisableHighlight = false;
        g.NavMoveRequestForward = ImGuiNavForward_None;
    }

    // Apply application mouse position movement, after we had a chance to process move request result.
    if (g.NavMousePosDirty && g.NavIdIsAlive)
    {
        // Set mouse position given our knowledge of the navigated item position from last frame
        if ((g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos) && (g.IO.BackendFlags & ImGuiBackendFlags_HasSetMousePos))
        {
            IM_ASSERT(!g.NavDisableHighlight && g.NavDisableMouseHover);
            g.IO.MousePos = g.IO.MousePosPrev = NavCalcPreferredRefPos();
            g.IO.WantSetMousePos = true;
        }
        g.NavMousePosDirty = false;
    }
    g.NavIdIsAlive = false;
    g.NavJustTabbedId = 0;
    IM_ASSERT(g.NavLayer == 0 || g.NavLayer == 1);

    // Store our return window (for returning from Layer 1 to Layer 0) and clear it as soon as we step back in our own Layer 0
    if (g.NavWindow)
        NavSaveLastChildNavWindow(g.NavWindow);
    if (g.NavWindow && g.NavWindow->NavLastChildNavWindow != NULL && g.NavLayer == 0)
        g.NavWindow->NavLastChildNavWindow = NULL;

    NavUpdateWindowing();

    // Set output flags for user application
    bool nav_keyboard_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    bool nav_gamepad_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) != 0 && (g.IO.BackendFlags & ImGuiBackendFlags_HasGamepad) != 0;
    g.IO.NavActive = (nav_keyboard_active || nav_gamepad_active) && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs);
    g.IO.NavVisible = (g.IO.NavActive && g.NavId != 0 && !g.NavDisableHighlight) || (g.NavWindowingTarget != NULL) || g.NavInitRequest;

    // Process NavCancel input (to close a popup, get back to parent, clear focus)
    if (IsNavInputPressed(ImGuiNavInput_Cancel, ImGuiInputReadMode_Pressed))
    {
        if (g.ActiveId != 0)
        {
            ClearActiveID();
        }
        else if (g.NavWindow && (g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow) && !(g.NavWindow->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->ParentWindow)
        {
            // Exit child window
            ImGuiWindow* child_window = g.NavWindow;
            ImGuiWindow* parent_window = g.NavWindow->ParentWindow;
            IM_ASSERT(child_window->ChildId != 0);
            FocusWindow(parent_window);
            SetNavID(child_window->ChildId, 0);
            g.NavIdIsAlive = false;
            if (g.NavDisableMouseHover)
                g.NavMousePosDirty = true;
        }
        else if (g.OpenPopupStack.Size > 0)
        {
            // Close open popup/menu
            if (!(g.OpenPopupStack.back().Window->Flags & ImGuiWindowFlags_Modal))
                ClosePopupToLevel(g.OpenPopupStack.Size - 1);
        }
        else if (g.NavLayer != 0)
        {
            // Leave the "menu" layer
            NavRestoreLayer(0);
        }
        else
        {
            // Clear NavLastId for popups but keep it for regular child window so we can leave one and come back where we were
            if (g.NavWindow && ((g.NavWindow->Flags & ImGuiWindowFlags_Popup) || !(g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow)))
                g.NavWindow->NavLastIds[0] = 0;
            g.NavId = 0;
        }
    }

    // Process manual activation request
    g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavInputId = 0;
    if (g.NavId != 0 && !g.NavDisableHighlight && !g.NavWindowingTarget && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
    {
        bool activate_down = IsNavInputDown(ImGuiNavInput_Activate);
        bool activate_pressed = activate_down && IsNavInputPressed(ImGuiNavInput_Activate, ImGuiInputReadMode_Pressed);
        if (g.ActiveId == 0 && activate_pressed)
            g.NavActivateId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_down)
            g.NavActivateDownId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_pressed)
            g.NavActivatePressedId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && IsNavInputPressed(ImGuiNavInput_Input, ImGuiInputReadMode_Pressed))
            g.NavInputId = g.NavId;
    }
    if (g.NavWindow && (g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
        g.NavDisableHighlight = true;
    if (g.NavActivateId != 0)
        IM_ASSERT(g.NavActivateDownId == g.NavActivateId);
    g.NavMoveRequest = false;

    // Process programmatic activation request
    if (g.NavNextActivateId != 0)
        g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavInputId = g.NavNextActivateId;
    g.NavNextActivateId = 0;

    // Initiate directional inputs request
    const int allowed_dir_flags = (g.ActiveId == 0) ? ~0 : g.ActiveIdAllowNavDirFlags;
    if (g.NavMoveRequestForward == ImGuiNavForward_None)
    {
        g.NavMoveDir = ImGuiDir_None;
        g.NavMoveRequestFlags = 0;
        if (g.NavWindow && !g.NavWindowingTarget && allowed_dir_flags && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
        {
            if ((allowed_dir_flags & (1<<ImGuiDir_Left))  && IsNavInputPressedAnyOfTwo(ImGuiNavInput_DpadLeft, ImGuiNavInput_KeyLeft_, ImGuiInputReadMode_Repeat)) g.NavMoveDir = ImGuiDir_Left;
            if ((allowed_dir_flags & (1<<ImGuiDir_Right)) && IsNavInputPressedAnyOfTwo(ImGuiNavInput_DpadRight,ImGuiNavInput_KeyRight_,ImGuiInputReadMode_Repeat)) g.NavMoveDir = ImGuiDir_Right;
            if ((allowed_dir_flags & (1<<ImGuiDir_Up))    && IsNavInputPressedAnyOfTwo(ImGuiNavInput_DpadUp,   ImGuiNavInput_KeyUp_,   ImGuiInputReadMode_Repeat)) g.NavMoveDir = ImGuiDir_Up;
            if ((allowed_dir_flags & (1<<ImGuiDir_Down))  && IsNavInputPressedAnyOfTwo(ImGuiNavInput_DpadDown, ImGuiNavInput_KeyDown_, ImGuiInputReadMode_Repeat)) g.NavMoveDir = ImGuiDir_Down;
        }
        g.NavMoveClipDir = g.NavMoveDir;
    }
    else
    {
        // Forwarding previous request (which has been modified, e.g. wrap around menus rewrite the requests with a starting rectangle at the other side of the window)
        // (Preserve g.NavMoveRequestFlags, g.NavMoveClipDir which were set by the NavMoveRequestForward() function)
        IM_ASSERT(g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None);
        IM_ASSERT(g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued);
        g.NavMoveRequestForward = ImGuiNavForward_ForwardActive;
    }

    if (g.NavMoveDir != ImGuiDir_None)
    {
        g.NavMoveRequest = true;
        g.NavMoveDirLast = g.NavMoveDir;
    }

    // If we initiate a movement request and have no current NavId, we initiate a InitDefautRequest that will be used as a fallback if the direction fails to find a match
    if (g.NavMoveRequest && g.NavId == 0)
    {
        g.NavInitRequest = g.NavInitRequestFromMove = true;
        g.NavInitResultId = 0;
        g.NavDisableHighlight = false;
    }

    NavUpdateAnyRequestFlag();

    // Scrolling
    if (g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.NavWindowingTarget)
    {
        // *Fallback* manual-scroll with NavUp/NavDown when window has no navigable item
        ImGuiWindow* window = g.NavWindow;
        const float scroll_speed = ImFloor(window->CalcFontSize() * 100 * g.IO.DeltaTime + 0.5f); // We need round the scrolling speed because sub-pixel scroll isn't reliably supported.
        if (window->DC.NavLayerActiveMask == 0x00 && window->DC.NavHasScroll && g.NavMoveRequest)
        {
            if (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right)
                SetWindowScrollX(window, ImFloor(window->Scroll.x + ((g.NavMoveDir == ImGuiDir_Left) ? -1.0f : +1.0f) * scroll_speed));
            if (g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down)
                SetWindowScrollY(window, ImFloor(window->Scroll.y + ((g.NavMoveDir == ImGuiDir_Up) ? -1.0f : +1.0f) * scroll_speed));
        }

        // *Normal* Manual scroll with NavScrollXXX keys
        // Next movement request will clamp the NavId reference rectangle to the visible area, so navigation will resume within those bounds.
        ImVec2 scroll_dir = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down, 1.0f/10.0f, 10.0f);
        if (scroll_dir.x != 0.0f && window->ScrollbarX)
        {
            SetWindowScrollX(window, ImFloor(window->Scroll.x + scroll_dir.x * scroll_speed));
            g.NavMoveFromClampedRefRect = true;
        }
        if (scroll_dir.y != 0.0f)
        {
            SetWindowScrollY(window, ImFloor(window->Scroll.y + scroll_dir.y * scroll_speed));
            g.NavMoveFromClampedRefRect = true;
        }
    }

    // Reset search results
    g.NavMoveResultLocal.Clear();
    g.NavMoveResultOther.Clear();

    // When we have manually scrolled (without using navigation) and NavId becomes out of bounds, we project its bounding box to the visible area to restart navigation within visible items
    if (g.NavMoveRequest && g.NavMoveFromClampedRefRect && g.NavLayer == 0)
    {
        ImGuiWindow* window = g.NavWindow;
        ImRect window_rect_rel(window->InnerMainRect.Min - window->Pos - ImVec2(1,1), window->InnerMainRect.Max - window->Pos + ImVec2(1,1));
        if (!window_rect_rel.Contains(window->NavRectRel[g.NavLayer]))
        {
            float pad = window->CalcFontSize() * 0.5f;
            window_rect_rel.Expand(ImVec2(-ImMin(window_rect_rel.GetWidth(), pad), -ImMin(window_rect_rel.GetHeight(), pad))); // Terrible approximation for the intent of starting navigation from first fully visible item
            window->NavRectRel[g.NavLayer].ClipWith(window_rect_rel);
            g.NavId = 0;
        }
        g.NavMoveFromClampedRefRect = false;
    }

    // For scoring we use a single segment on the left side our current item bounding box (not touching the edge to avoid box overlap with zero-spaced items)
    ImRect nav_rect_rel = (g.NavWindow && !g.NavWindow->NavRectRel[g.NavLayer].IsInverted()) ? g.NavWindow->NavRectRel[g.NavLayer] : ImRect(0,0,0,0);
    g.NavScoringRectScreen = g.NavWindow ? ImRect(g.NavWindow->Pos + nav_rect_rel.Min, g.NavWindow->Pos + nav_rect_rel.Max) : GetViewportRect();
    g.NavScoringRectScreen.Min.x = ImMin(g.NavScoringRectScreen.Min.x + 1.0f, g.NavScoringRectScreen.Max.x);
    g.NavScoringRectScreen.Max.x = g.NavScoringRectScreen.Min.x;
    IM_ASSERT(!g.NavScoringRectScreen.IsInverted()); // Ensure if we have a finite, non-inverted bounding box here will allows us to remove extraneous ImFabs() calls in NavScoreItem().
    //g.OverlayDrawList.AddRect(g.NavScoringRectScreen.Min, g.NavScoringRectScreen.Max, IM_COL32(255,200,0,255)); // [DEBUG]
    g.NavScoringCount = 0;
#if IMGUI_DEBUG_NAV_RECTS
    if (g.NavWindow) { for (int layer = 0; layer < 2; layer++) GetOverlayDrawList()->AddRect(g.NavWindow->Pos + g.NavWindow->NavRectRel[layer].Min, g.NavWindow->Pos + g.NavWindow->NavRectRel[layer].Max, IM_COL32(255,200,0,255)); } // [DEBUG]
    if (g.NavWindow) { ImU32 col = (g.NavWindow->HiddenFrames == 0) ? IM_COL32(255,0,255,255) : IM_COL32(255,0,0,255); ImVec2 p = NavCalcPreferredRefPos(); char buf[32]; ImFormatString(buf, 32, "%d", g.NavLayer); g.OverlayDrawList.AddCircleFilled(p, 3.0f, col); g.OverlayDrawList.AddText(NULL, 13.0f, p + ImVec2(8,-4), col, buf); }
#endif
}